

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImU32 *pIVar1;
  ImGuiItemStatusFlags *pIVar2;
  int *piVar3;
  ImGuiWindow *pIVar4;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  byte bVar10;
  ImU32 IVar11;
  ImU32 fill_col;
  ImGuiWindowTempData *pIVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  bool hovered;
  bool held;
  ImRect frame_bb;
  ImVec2 label_size;
  ImRect interact_bb;
  bool local_c2;
  bool local_c1;
  ImVec2 local_c0;
  ImRect local_b8;
  ImVec2 local_a8;
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  char *local_78;
  char *local_70;
  undefined1 local_68 [16];
  ImRect local_58;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems == false) {
    if ((flags & 0x402U) == 0) {
      fVar16 = (pIVar4->DC).CurrLineTextBaseOffset;
      fVar15 = (pIVar5->Style).FramePadding.y;
      if (fVar15 <= fVar16) {
        fVar16 = fVar15;
      }
    }
    else {
      fVar16 = (pIVar5->Style).FramePadding.y;
    }
    local_98 = ZEXT416((uint)fVar16);
    local_68 = ZEXT416((uint)(pIVar5->Style).FramePadding.x);
    if (label_end == (char *)0x0) {
      label_end = FindRenderedTextEnd(label,(char *)0x0);
    }
    local_78 = label_end;
    local_a8 = CalcTextSize(label,label_end,false,-1.0);
    pIVar12 = (ImGuiWindowTempData *)&pIVar4->WorkRect;
    if (((uint)flags >> 0xc & 1) == 0) {
      pIVar12 = &pIVar4->DC;
    }
    fVar16 = (pIVar4->DC).CurrLineSize.y;
    fVar15 = (pIVar5->Style).FramePadding.y;
    fVar15 = fVar15 + fVar15 + pIVar5->FontSize;
    if (fVar15 <= fVar16) {
      fVar16 = fVar15;
    }
    fVar15 = (float)local_98._0_4_ + (float)local_98._0_4_ + local_a8.y;
    uVar14 = -(uint)(fVar15 <= fVar16);
    local_58.Min.y = (float)(~uVar14 & (uint)fVar15 | (uint)fVar16 & uVar14);
    local_b8.Min.x = (pIVar12->CursorPos).x;
    local_b8.Min.y = (pIVar4->DC).CursorPos.y;
    local_b8.Max.x = (pIVar4->WorkRect).Max.x;
    if ((flags & 2U) == 0) {
      fVar16 = 2.0;
    }
    else {
      fVar16 = (pIVar4->WindowPadding).x * 0.5;
      local_b8.Min.x = local_b8.Min.x - (float)(int)(fVar16 + -1.0);
      local_b8.Max.x = local_b8.Max.x + (float)(int)fVar16;
      fVar16 = 3.0;
    }
    local_b8.Max.y = local_58.Min.y + local_b8.Min.y;
    fVar15 = fVar16 * (float)local_68._0_4_ + pIVar5->FontSize;
    fVar16 = (pIVar4->DC).CurrLineTextBaseOffset;
    uVar14 = -(uint)(fVar16 <= (float)local_98._0_4_);
    local_9c = (float)local_68._0_4_ + (float)local_68._0_4_;
    local_58.Min.x =
         (float)(-(uint)(0.0 < local_a8.x) & (uint)(local_9c + local_a8.x)) + pIVar5->FontSize;
    local_88 = ZEXT416((uint)fVar15);
    local_c0.y = (float)(~uVar14 & (uint)fVar16 | uVar14 & local_98._0_4_) + local_b8.Min.y;
    local_c0.x = (pIVar4->DC).CursorPos.x + fVar15;
    local_48 = ZEXT416((uint)local_58.Min.x);
    local_70 = label;
    ItemSize(&local_58.Min,(float)local_98._0_4_);
    local_58.Min = local_b8.Min;
    local_58.Max = local_b8.Max;
    if ((flags & 0x1802U) == 0) {
      fVar16 = (pIVar5->Style).ItemSpacing.x;
      local_58.Max.y = local_b8.Max.y;
      local_58.Max.x = fVar16 + fVar16 + (float)local_48._0_4_ + local_b8.Min.x;
    }
    bVar6 = TreeNodeBehaviorIsOpen(id,flags);
    if (((bVar6) && ((flags & 0x2008U) == 0x2000)) && (pIVar5->NavIdIsAlive == false)) {
      pIVar1 = &(pIVar4->DC).TreeJumpToParentOnPopMask;
      *pIVar1 = *pIVar1 | 1 << ((byte)(pIVar4->DC).TreeDepth & 0x1f);
    }
    bVar7 = ItemAdd(&local_58,id,(ImRect *)0x0,0);
    pIVar2 = &(pIVar5->LastItemData).StatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 2;
    (pIVar5->LastItemData).DisplayRect.Min = local_b8.Min;
    (pIVar5->LastItemData).DisplayRect.Max = local_b8.Max;
    if (bVar7) {
      local_98._0_4_ = flags & 4U;
      uVar13 = (flags & 4U) * 0x400;
      uVar14 = uVar13 + 0x200;
      if (((uint)flags >> 8 & 1) != 0) {
        uVar14 = uVar13;
      }
      fVar16 = (pIVar5->Style).TouchExtraPadding.x;
      fVar15 = (pIVar5->IO).MousePos.x;
      if ((local_c0.x - (float)local_88._0_4_) - fVar16 <= fVar15) {
        bVar7 = fVar15 < fVar16 + (local_c0.x - (float)local_88._0_4_) + local_9c + pIVar5->FontSize
        ;
      }
      else {
        bVar7 = false;
      }
      uVar13 = uVar14;
      if (pIVar4 != pIVar5->HoveredWindow) {
        uVar13 = uVar14 + 0x10000;
      }
      if (!bVar7) {
        uVar13 = uVar14 + 0x10000;
      }
      uVar14 = 0x10;
      if (!bVar7) {
        uVar14 = (flags & 0x40U) * 4 + 0x20;
      }
      bVar8 = ButtonBehavior(&local_58,id,&local_c2,&local_c1,uVar14 | uVar13);
      if (((uint)flags >> 8 & 1) == 0) {
        if (bVar8) {
          if (pIVar5->DragDropHoldJustPressedId == id) {
            bVar9 = bVar8 && !bVar6;
          }
          else {
            if (((flags & 0xc0U) == 0) || (pIVar5->NavActivateId == id)) {
              bVar10 = 1;
            }
            else {
              bVar10 = 0;
            }
            if ((char)flags < '\0') {
              bVar9 = 0;
              if (bVar7) {
                bVar9 = pIVar5->NavDisableMouseHover ^ 1;
              }
              bVar10 = bVar10 | bVar9;
            }
            bVar9 = bVar10;
            if (((flags & 0x40U) != 0) && (bVar9 = 1, (pIVar5->IO).MouseClickedCount[0] != 2)) {
              bVar9 = bVar10;
            }
          }
        }
        else {
          bVar9 = 0;
        }
        if ((pIVar5->NavId == id) && (bVar6 && pIVar5->NavMoveDir == 0)) {
          NavMoveRequestCancel();
          bVar9 = 1;
        }
        if ((pIVar5->NavId == id) && (pIVar5->NavMoveDir == 1 && !bVar6)) {
          NavMoveRequestCancel();
          bVar9 = 1;
        }
        if (bVar9 != 0) {
          bVar6 = !bVar6;
          ImGuiStorage::SetInt((pIVar4->DC).StateStorage,id,(uint)bVar6);
          pIVar2 = &(pIVar5->LastItemData).StatusFlags;
          *(byte *)pIVar2 = (byte)*pIVar2 | 0x10;
        }
      }
      if (local_98._0_4_ != 0) {
        SetItemAllowOverlap();
      }
      IVar11 = GetColorU32(0,1.0);
      if ((flags & 2U) == 0) {
        if (((flags & 1U) == 0 & (local_c2 ^ 1U)) == 0) {
          uVar14 = 0x1a;
          if ((local_c1 & local_c2) == 0) {
            uVar14 = local_c2 | 0x18;
          }
          fill_col = GetColorU32(uVar14,1.0);
          RenderFrame(local_b8.Min,local_b8.Max,fill_col,false,0.0);
        }
        RenderNavHighlight(&local_b8,id,2);
        if (((uint)flags >> 9 & 1) == 0) {
          if (((uint)flags >> 8 & 1) == 0) {
            pos_02.y = pIVar5->FontSize * 0.15 + local_c0.y;
            pos_02.x = (float)local_68._0_4_ + (local_c0.x - (float)local_88._0_4_);
            RenderArrow(pIVar4->DrawList,pos_02,IVar11,(uint)bVar6 * 2 + 1,0.7);
          }
        }
        else {
          pos_01.y = pIVar5->FontSize * 0.5 + local_c0.y;
          pos_01.x = -(float)local_88._0_4_ * 0.5 + local_c0.x;
          RenderBullet(pIVar4->DrawList,pos_01,IVar11);
        }
        if (pIVar5->LogEnabled == true) {
          LogSetNextTextDecoration(">",(char *)0x0);
        }
        RenderText(local_c0,local_70,local_78,false);
      }
      else {
        local_98._0_4_ = IVar11;
        if ((local_c1 != true) || (uVar14 = 0x1a, local_c2 == false)) {
          uVar14 = local_c2 | 0x18;
        }
        IVar11 = GetColorU32(uVar14,1.0);
        RenderFrame(local_b8.Min,local_b8.Max,IVar11,true,(pIVar5->Style).FrameRounding);
        RenderNavHighlight(&local_b8,id,2);
        if (((uint)flags >> 9 & 1) == 0) {
          if (((uint)flags >> 8 & 1) == 0) {
            pos_00.y = local_c0.y;
            pos_00.x = (float)local_68._0_4_ + (local_c0.x - (float)local_88._0_4_);
            RenderArrow(pIVar4->DrawList,pos_00,local_98._0_4_,bVar6 + 1 + (uint)bVar6,1.0);
          }
          else {
            local_c0.x = local_c0.x - (float)local_88._0_4_;
          }
        }
        else {
          pos.y = pIVar5->FontSize * 0.5 + local_c0.y;
          pos.x = -(float)local_88._0_4_ * 0.6 + local_c0.x;
          RenderBullet(pIVar4->DrawList,pos,local_98._0_4_);
        }
        if (((uint)flags >> 0x14 & 1) != 0) {
          local_b8.Max.x = local_b8.Max.x - (pIVar5->FontSize + (pIVar5->Style).FramePadding.x);
        }
        if (pIVar5->LogEnabled == true) {
          LogSetNextTextDecoration("###","###");
        }
        local_38.x = 0.0;
        local_38.y = 0.0;
        RenderTextClipped(&local_c0,&local_b8.Max,local_70,local_78,&local_a8,&local_38,
                          (ImRect *)0x0);
      }
    }
    if (bVar6 == true && (char)((flags & 8U) >> 3) == '\0') {
      pIVar4 = GImGui->CurrentWindow;
      Indent(0.0);
      piVar3 = &(pIVar4->DC).TreeDepth;
      *piVar3 = *piVar3 + 1;
      PushOverrideID(id);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}